

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::SetNetworkActive(CConnman *this,bool active)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  bool *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  bool active_local;
  string local_58;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  active_local = active;
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<char[17],bool>
              (&local_58,(tinyformat *)0x69cd1e,"SetNetworkActive",(char (*) [17])&active_local,
               in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    pLVar3 = LogInstance();
    local_58._M_dataplus._M_p = &DAT_00000050;
    local_58._M_string_length = 0x69b9d1;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "SetNetworkActive";
    logging_function._M_len = 0x10;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0xc58,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  if (active_local != (bool)((this->fNetworkActive)._M_base._M_i & 1U)) {
    LOCK();
    (this->fNetworkActive)._M_base._M_i = active_local;
    UNLOCK();
    if (this->m_client_interface != (CClientUIInterface *)0x0) {
      CClientUIInterface::NotifyNetworkActiveChanged
                (this->m_client_interface,(bool)((this->fNetworkActive)._M_base._M_i & 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::SetNetworkActive(bool active)
{
    LogPrintf("%s: %s\n", __func__, active);

    if (fNetworkActive == active) {
        return;
    }

    fNetworkActive = active;

    if (m_client_interface) {
        m_client_interface->NotifyNetworkActiveChanged(fNetworkActive);
    }
}